

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O1

void __thiscall cmCTestLaunchReporter::ComputeFileNames(cmCTestLaunchReporter *this)

{
  string *path;
  pointer pbVar1;
  bool bVar2;
  string *realArg;
  pointer pbVar3;
  string_view input;
  string_view input_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmCryptoHash md5;
  string d;
  cmCryptoHash cStack_b8;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_LAUNCH_LOGS",&local_a8);
  if (bVar2 && local_a8._M_string_length != 0) {
    this->Passthru = false;
    path = &this->LogDir;
    std::__cxx11::string::_M_assign((string *)path);
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    std::__cxx11::string::append((char *)path);
    cmCryptoHash::cmCryptoHash(&cStack_b8,AlgoMD5);
    cmCryptoHash::Initialize(&cStack_b8);
    input._M_str = (this->CWD)._M_dataplus._M_p;
    input._M_len = (this->CWD)._M_string_length;
    cmCryptoHash::Append(&cStack_b8,input);
    pbVar1 = (this->RealArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (this->RealArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      input_00._M_str = (pbVar3->_M_dataplus)._M_p;
      input_00._M_len = pbVar3->_M_string_length;
      cmCryptoHash::Append(&cStack_b8,input_00);
    }
    cmCryptoHash::FinalizeHex_abi_cxx11_((string *)local_68,&cStack_b8);
    std::__cxx11::string::operator=((string *)&this->LogHash,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    local_68._8_8_ = (this->LogDir)._M_dataplus._M_p;
    local_68._0_8_ = (this->LogDir)._M_string_length;
    local_68._16_8_ = 7;
    local_68._24_8_ = "launch-";
    local_40 = (this->LogHash)._M_dataplus._M_p;
    local_48 = (this->LogHash)._M_string_length;
    local_38 = 8;
    local_30 = "-out.txt";
    views._M_len = 4;
    views._M_array = (iterator)local_68;
    cmCatViews_abi_cxx11_(&local_88,views);
    std::__cxx11::string::operator=((string *)&this->LogOut,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_68._8_8_ = (this->LogDir)._M_dataplus._M_p;
    local_68._0_8_ = (this->LogDir)._M_string_length;
    local_68._16_8_ = 7;
    local_68._24_8_ = "launch-";
    local_40 = (this->LogHash)._M_dataplus._M_p;
    local_48 = (this->LogHash)._M_string_length;
    local_38 = 8;
    local_30 = "-err.txt";
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_68;
    cmCatViews_abi_cxx11_(&local_88,views_00);
    std::__cxx11::string::operator=((string *)&this->LogErr,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    cmCryptoHash::~cmCryptoHash(&cStack_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmCTestLaunchReporter::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  std::string d;
  if (!cmSystemTools::GetEnv("CTEST_LAUNCH_LOGS", d) || d.empty()) {
    return;
  }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  cmCryptoHash md5(cmCryptoHash::AlgoMD5);
  md5.Initialize();
  md5.Append(this->CWD);
  for (std::string const& realArg : this->RealArgs) {
    md5.Append(realArg);
  }
  this->LogHash = md5.FinalizeHex();

  // We store stdout and stderr in temporary log files.
  this->LogOut = cmStrCat(this->LogDir, "launch-", this->LogHash, "-out.txt");
  this->LogErr = cmStrCat(this->LogDir, "launch-", this->LogHash, "-err.txt");
}